

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

string * __thiscall
nonius::detail::pretty_duration_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,fp_seconds secs)

{
  ostream *poVar1;
  double magnitude;
  string units;
  ostringstream ss;
  long local_178 [46];
  
  if (2.0 <= secs.__r) {
    magnitude = 1.0;
  }
  else if (0.002 <= secs.__r) {
    magnitude = 1000.0;
  }
  else {
    magnitude = *(double *)(&DAT_0017d2e0 + (ulong)(secs.__r < 2e-06) * 8);
  }
  units_for_magnitude_abi_cxx11_(&units,this,magnitude);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  *(long *)((long)local_178 + *(long *)(_ss + -0x18)) =
       (long)*(int *)((long)local_178 + *(long *)(_ss + -0x18));
  poVar1 = std::ostream::_M_insert<double>(magnitude * secs.__r);
  poVar1 = std::operator<<(poVar1,' ');
  std::operator<<(poVar1,(string *)&units);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  std::__cxx11::string::~string((string *)&units);
  return __return_storage_ptr__;
}

Assistant:

inline std::string pretty_duration(fp_seconds secs) {
            auto magnitude = get_magnitude(secs);
            auto units = units_for_magnitude(magnitude);
#ifdef NONIUS_MSVC
            if(units == "μs") units = "us";
#endif
            std::ostringstream ss;
            ss << std::setprecision(ss.precision());
            ss << (secs.count() * magnitude) << ' ' << units;
            return ss.str();
        }